

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

void Curl_pgrsResetTransferSizes(Curl_easy *data)

{
  int *piVar1;
  
  (data->progress).size_dl = 0;
  (data->progress).size_ul = 0;
  piVar1 = &(data->progress).flags;
  *(byte *)piVar1 = (byte)*piVar1 & 0x9f;
  return;
}

Assistant:

void Curl_pgrsSetDownloadSize(struct Curl_easy *data, curl_off_t size)
{
  if(size >= 0) {
    data->progress.size_dl = size;
    data->progress.flags |= PGRS_DL_SIZE_KNOWN;
  }
  else {
    data->progress.size_dl = 0;
    data->progress.flags &= ~PGRS_DL_SIZE_KNOWN;
  }
}